

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_gather2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  undefined8 *puVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  C_Integer *pCVar6;
  long lVar7;
  long lVar8;
  Integer IVar9;
  int _i;
  int iVar10;
  void *__ptr;
  logical lVar11;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined4 uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  void **ppvVar22;
  long lVar23;
  void *pvVar24;
  global_array_t *pgVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  C_Integer CVar36;
  long lVar37;
  Integer IVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  armci_giov_t desc;
  Integer subscrpt [2];
  Integer hi [2];
  Integer lo [2];
  Integer _lo [2];
  char err_string [256];
  
  if (0 < nv) {
    lVar40 = g_a + 1000;
    if ((g_a < -1000) || (_max_global_array <= lVar40)) {
      sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_gather");
      pnga_error(err_string,g_a);
    }
    if (GA[lVar40].actv == 0) {
      sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_gather");
      pnga_error(err_string,g_a);
    }
    GAstat.numgat = GAstat.numgat + 1;
    iVar5 = GA[lVar40].p_handle;
    lVar23 = (long)iVar5;
    if (lVar23 < 0) {
      lVar37 = GA[lVar40].num_rstrctd;
      if (GA[lVar40].num_rstrctd < 1) {
        lVar37 = GAnproc;
      }
    }
    else {
      lVar37 = (long)PGRP_LIST[lVar23].map_nproc;
    }
    if (GA[lVar40].distr_type == 0) {
      __ptr = malloc((nv << 0x20) + (lVar37 << 0x22) >> 0x1d);
      lVar34 = 0;
      lVar16 = lVar37;
    }
    else {
      lVar34 = GA[lVar40].block_total;
      __ptr = malloc((nv << 0x20) + (lVar34 << 0x22) >> 0x1d);
      lVar16 = lVar34;
    }
    if (__ptr == (void *)0x0) {
      pnga_error("malloc failed",lVar16 * 3);
      __ptr = (void *)0x0;
    }
    pgVar25 = GA;
    puVar1 = (undefined8 *)((long)__ptr + nv * 8);
    if (GA[lVar40].distr_type == 0) {
      lVar16 = 0;
      puVar13 = puVar1;
      if (0 < lVar37) {
        lVar16 = lVar37;
      }
      while (bVar41 = lVar16 != 0, lVar16 = lVar16 + -1, lVar7 = lVar37, bVar41) {
        *puVar13 = 0;
        puVar13[lVar37] = 0;
        puVar13 = puVar13 + 1;
      }
    }
    else {
      lVar16 = 0;
      puVar13 = puVar1;
      if (0 < lVar34) {
        lVar16 = lVar34;
      }
      while (bVar41 = lVar16 != 0, lVar16 = lVar16 + -1, lVar7 = lVar34, bVar41) {
        *puVar13 = 0;
        puVar13[lVar34] = 0;
        puVar13 = puVar13 + 1;
      }
    }
    if (pgVar25[lVar40].num_rstrctd == 0) {
      lVar16 = 0;
      IVar38 = nv;
      while (bVar41 = IVar38 != 0, IVar38 = IVar38 + -1, pgVar25 = GA, bVar41) {
        subscrpt[0] = *(Integer *)((long)i + lVar16);
        subscrpt[1] = *(Integer *)((long)j + lVar16);
        lVar11 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar16));
        if (lVar11 == 0) {
          sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar16),
                  *(undefined8 *)((long)j + lVar16));
          pnga_error(err_string,g_a);
        }
        puVar1[lVar7 + *(Integer *)((long)__ptr + lVar16)] =
             puVar1[lVar7 + *(Integer *)((long)__ptr + lVar16)] + 1;
        lVar16 = lVar16 + 8;
      }
    }
    else {
      lVar16 = 0;
      IVar38 = nv;
      while (bVar41 = IVar38 != 0, IVar38 = IVar38 + -1, bVar41) {
        subscrpt[0] = *(Integer *)((long)i + lVar16);
        subscrpt[1] = *(Integer *)((long)j + lVar16);
        lVar11 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar16));
        if (lVar11 == 0) {
          sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar16),
                  *(undefined8 *)((long)j + lVar16));
          pnga_error(err_string,g_a);
        }
        pgVar25 = GA;
        puVar1[lVar7 + GA[lVar40].rank_rstrctd[*(Integer *)((long)__ptr + lVar16)]] =
             puVar1[lVar7 + GA[lVar40].rank_rstrctd[*(Integer *)((long)__ptr + lVar16)]] + 1;
        lVar16 = lVar16 + 8;
      }
    }
    iVar28 = pgVar25[lVar40].distr_type;
    if (iVar28 == 0) {
      lVar16 = 0;
      lVar34 = 0;
      if (0 < lVar37) {
        lVar34 = lVar37;
      }
      for (lVar12 = 0; lVar34 != lVar12; lVar12 = lVar12 + 1) {
        if (0 < (long)puVar1[lVar7 + lVar12]) {
          puVar1[lVar7 * 2 + lVar16] = lVar12;
          puVar1[lVar7 * 3 + lVar12] = lVar16;
          lVar16 = lVar16 + 1;
        }
      }
    }
    else {
      lVar16 = 0;
      if (lVar34 < 1) {
        lVar34 = lVar16;
      }
      for (lVar12 = 0; lVar34 != lVar12; lVar12 = lVar12 + 1) {
        if (0 < (long)puVar1[lVar7 + lVar12]) {
          puVar1[lVar7 * 2 + lVar16] = lVar12;
          puVar1[lVar7 * 3 + lVar12] = lVar16;
          lVar16 = lVar16 + 1;
        }
      }
    }
    GAstat.numgat_procs = GAstat.numgat_procs + lVar16;
    lVar34 = nv * 0x10;
    puVar13 = (undefined8 *)malloc((long)((int)lVar16 * 0x38 + (int)lVar34 + (int)(lVar16 * 8)));
    if (puVar13 == (undefined8 *)0x0) {
      pnga_error("malloc failed",lVar16);
      iVar28 = GA[lVar40].distr_type;
      pgVar25 = GA;
    }
    pvVar24 = puVar13 + lVar16 * 2;
    lVar12 = lVar16 * 8 + lVar34;
    lVar19 = lVar16 * 8 + lVar12;
    lVar33 = lVar16 * 8 + lVar19;
    lVar18 = lVar16 * 8 + lVar33;
    lVar8 = lVar16 * 8 + lVar18;
    if (iVar28 == 0) {
      lVar35 = 0;
      if (0 < lVar16) {
        lVar35 = lVar16;
      }
      for (lVar39 = 0; lVar39 != lVar35; lVar39 = lVar39 + 1) {
        lVar26 = puVar1[lVar7 * 2 + lVar39];
        if (0 < pgVar25[lVar40].num_rstrctd) {
          lVar26 = pgVar25[lVar40].rstrctd_list[lVar26];
        }
        pnga_distribution(g_a,lVar26,lo,hi);
        *(Integer *)((long)pvVar24 + lVar39 * 8 + lVar12) = lo[0];
        *(Integer *)((long)pvVar24 + lVar39 * 8 + lVar33) = lo[1];
        *(Integer *)((long)pvVar24 + lVar39 * 8 + lVar19) = hi[0];
        *(Integer *)((long)pvVar24 + lVar39 * 8 + lVar18) = hi[1];
        pgVar25 = GA + lVar40;
        lVar26 = GA[lVar40].width[0];
        lVar30 = GA[lVar40].width[1];
        lVar29 = GA[lVar40].num_rstrctd;
        iVar28 = GA[lVar40].distr_type;
        if (iVar28 - 1U < 3) {
          sVar2 = pgVar25->ndim;
          lVar14 = puVar1[lVar7 * 2 + lVar39];
          lVar20 = (long)(int)lVar14 % pgVar25->num_blocks[0];
          uVar17 = (undefined4)lVar20;
          err_string[0] = (char)uVar17;
          err_string[1] = (char)((uint)uVar17 >> 8);
          err_string[2] = (char)((uint)uVar17 >> 0x10);
          err_string[3] = (char)((uint)uVar17 >> 0x18);
          lVar15 = 0;
          while (lVar15 + 1 < (long)sVar2) {
            lVar14 = (long)((int)lVar14 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar15];
            lVar20 = (long)(int)lVar14 % GA[g_a + 1000].num_blocks[lVar15 + 1];
            *(int *)(err_string + lVar15 * 4 + 4) = (int)lVar20;
            lVar15 = lVar15 + 1;
          }
          uVar27 = (uint)sVar2;
          if (sVar2 < 1) {
            uVar27 = 0;
          }
          for (uVar21 = 0; (uVar27 & 0xffff) << 2 != uVar21; uVar21 = uVar21 + 4) {
            iVar28 = *(int *)(err_string + uVar21);
            lVar14 = *(long *)((long)GA[g_a + 1000].block_dims + uVar21 * 2);
            *(long *)((long)_lo + uVar21 * 2) = lVar14 * iVar28 + 1;
            lVar14 = ((long)iVar28 + 1) * lVar14;
            lVar15 = *(long *)((long)GA[g_a + 1000].dims + uVar21 * 2);
            if (lVar15 <= lVar14) {
              lVar14 = lVar15;
            }
            *(long *)((long)&desc.src_ptr_array + uVar21 * 2) = lVar14;
          }
        }
        else if (iVar28 == 4) {
          sVar2 = pgVar25->ndim;
          lVar14 = puVar1[lVar7 * 2 + lVar39];
          lVar20 = (long)(int)lVar14 % pgVar25->num_blocks[0];
          uVar17 = (undefined4)lVar20;
          err_string[0] = (char)uVar17;
          err_string[1] = (char)((uint)uVar17 >> 8);
          err_string[2] = (char)((uint)uVar17 >> 0x10);
          err_string[3] = (char)((uint)uVar17 >> 0x18);
          lVar15 = 0;
          while (lVar15 + 1 < (long)sVar2) {
            lVar14 = (long)((int)lVar14 - (int)lVar20) / GA[g_a + 1000].num_blocks[lVar15];
            lVar20 = (long)(int)lVar14 % GA[g_a + 1000].num_blocks[lVar15 + 1];
            *(int *)(err_string + lVar15 * 4 + 4) = (int)lVar20;
            lVar15 = lVar15 + 1;
          }
          uVar21 = 0;
          uVar27 = (int)sVar2;
          if (sVar2 < 1) {
            uVar27 = 0;
          }
          iVar28 = 0;
          for (; (uVar27 & 0xffff) << 2 != uVar21; uVar21 = uVar21 + 4) {
            pCVar6 = GA[lVar40].mapc;
            iVar10 = *(int *)(err_string + uVar21);
            lVar15 = (long)iVar28 + (long)iVar10;
            *(C_Integer *)((long)_lo + uVar21 * 2) = pCVar6[lVar15];
            lVar14 = *(long *)((long)pgVar25->num_blocks + uVar21 * 2);
            if ((long)iVar10 < lVar14 + -1) {
              lVar15 = pCVar6[lVar15 + 1] + -1;
            }
            else {
              lVar15 = *(long *)((long)pgVar25->dims + uVar21 * 2);
            }
            *(long *)((long)&desc.src_ptr_array + uVar21 * 2) = lVar15;
            iVar28 = iVar28 + (int)lVar14;
          }
        }
        else if (iVar28 == 0) {
          if (lVar29 == 0) {
            uVar4 = pgVar25->ndim;
            if ((short)uVar4 < 1) {
              uVar4 = 0;
            }
            uVar21 = (ulong)uVar4;
            lVar14 = 1;
            for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
              lVar14 = lVar14 * GA[g_a + 1000].nblock[uVar31];
            }
            lVar15 = puVar1[lVar7 * 2 + lVar39];
            if (lVar15 < lVar14 && -1 < lVar15) {
              lVar14 = 0;
              for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
                lVar32 = (long)GA[g_a + 1000].nblock[uVar31];
                lVar20 = lVar15 % lVar32;
                pCVar6 = pgVar25->mapc;
                _lo[uVar31] = pCVar6[lVar20 + lVar14];
                if (lVar20 == lVar32 + -1) {
                  ppvVar22 = (void **)GA[g_a + 1000].dims[uVar31];
                }
                else {
                  ppvVar22 = (void **)(pCVar6[lVar20 + lVar14 + 1] + -1);
                }
                lVar14 = lVar14 + lVar32;
                (&desc.src_ptr_array)[uVar31] = ppvVar22;
                lVar15 = lVar15 / lVar32;
              }
            }
            else {
              for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
                _lo[uVar31] = 0;
                (&desc.src_ptr_array)[uVar31] = (void **)0xffffffffffffffff;
              }
            }
          }
          else {
            lVar14 = puVar1[lVar7 * 2 + lVar39];
            uVar3 = pgVar25->ndim;
            if ((short)uVar3 < 1) {
              uVar3 = 0;
            }
            uVar21 = (ulong)uVar3;
            if (lVar14 < lVar29) {
              lVar15 = 1;
              for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
                lVar15 = lVar15 * GA[g_a + 1000].nblock[uVar31];
              }
              if ((lVar14 < 0) || (lVar15 <= lVar14)) {
                for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
                  _lo[uVar31] = 0;
                  (&desc.src_ptr_array)[uVar31] = (void **)0xffffffffffffffff;
                }
              }
              else {
                lVar15 = 0;
                for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
                  lVar32 = (long)GA[g_a + 1000].nblock[uVar31];
                  lVar20 = lVar14 % lVar32;
                  pCVar6 = pgVar25->mapc;
                  _lo[uVar31] = pCVar6[lVar20 + lVar15];
                  if (lVar20 == lVar32 + -1) {
                    ppvVar22 = (void **)GA[g_a + 1000].dims[uVar31];
                  }
                  else {
                    ppvVar22 = (void **)(pCVar6[lVar20 + lVar15 + 1] + -1);
                  }
                  lVar15 = lVar15 + lVar32;
                  (&desc.src_ptr_array)[uVar31] = ppvVar22;
                  lVar14 = lVar14 / lVar32;
                }
              }
            }
            else {
              for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
                _lo[uVar31] = 0;
                (&desc.src_ptr_array)[uVar31] = (void **)0xffffffffffffffff;
              }
            }
          }
        }
        IVar9 = _lo[1];
        IVar38 = _lo[0];
        ppvVar22 = desc.src_ptr_array;
        if (pgVar25->p_handle == 0) {
          CVar36 = (C_Integer)PGRP_LIST->inv_map_proc_list[puVar1[lVar7 * 2 + lVar39]];
        }
        else {
          CVar36 = puVar1[lVar7 * 2 + lVar39];
          if (lVar29 != 0) {
            CVar36 = pgVar25->rstrctd_list[CVar36];
          }
        }
        lVar29 = *(long *)((long)pvVar24 + lVar39 * 8 + lVar12);
        lVar14 = *(long *)((long)pvVar24 + lVar39 * 8 + lVar33);
        if (((long)desc.src_ptr_array < lVar29 || lVar29 < _lo[0]) ||
           ((long)desc.dst_ptr_array < lVar14 || lVar14 < _lo[1])) {
          sprintf(err_string,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation");
          pnga_error(err_string,g_a);
          lVar29 = *(long *)((long)pvVar24 + lVar39 * 8 + lVar12);
          lVar14 = *(long *)((long)pvVar24 + lVar39 * 8 + lVar33);
        }
        pgVar25 = GA;
        lVar15 = ((lVar26 * 2 + 1) - IVar38) + (long)ppvVar22;
        *(char **)((long)pvVar24 + lVar39 * 8 + lVar34) =
             GA[lVar40].ptr[CVar36] +
             ((lVar26 - IVar38) + lVar29 + ((lVar30 - IVar9) + lVar14) * lVar15) *
             *(long *)(BYTE_ARRAY_001ce589 + (long)GA[lVar40].type * 0x10 + 0x1f);
        *(long *)((long)pvVar24 + lVar39 * 8 + lVar8) = lVar15;
      }
    }
    else {
      lVar39 = 0;
      lVar35 = 0;
      if (0 < lVar16) {
        lVar35 = lVar16;
      }
      while (bVar41 = lVar35 != 0, lVar35 = lVar35 + -1, pgVar25 = GA, bVar41) {
        IVar38 = *(Integer *)((long)puVar1 + lVar39 + lVar7 * 0x10);
        pnga_distribution(g_a,IVar38,lo,hi);
        *(Integer *)((long)pvVar24 + lVar39 + lVar12) = lo[0];
        *(Integer *)((long)pvVar24 + lVar39 + lVar33) = lo[1];
        *(Integer *)((long)pvVar24 + lVar39 + lVar19) = hi[0];
        *(Integer *)((long)pvVar24 + lVar39 + lVar18) = hi[1];
        pnga_access_block_ptr
                  (g_a,IVar38,(void *)((long)pvVar24 + lVar39 + lVar34),
                   (Integer *)((long)pvVar24 + lVar39 + lVar8));
        lVar39 = lVar39 + 8;
      }
    }
    iVar28 = pgVar25[lVar40].elemsize;
    GAbytes.gattot = (double)iVar28 * (double)nv + GAbytes.gattot;
    GAbytes.gatloc =
         (double)iVar28 * (double)(long)puVar1[lVar7 + *(long *)((long)__ptr + GAme * 8)] +
         GAbytes.gatloc;
    *puVar13 = pvVar24;
    puVar13[lVar16] = (void *)((long)pvVar24 + nv * 8);
    for (lVar35 = 1; lVar35 < lVar16; lVar35 = lVar35 + 1) {
      lVar39 = puVar1[lVar7 + puVar1[lVar7 * 2 + lVar35 + -1]];
      puVar13[lVar35] = puVar13[lVar35 + -1] + lVar39 * 8;
      puVar13[lVar16 + lVar35] = lVar39 * 8 + puVar13[lVar16 + lVar35 + -1];
    }
    for (lVar35 = 0; nv != lVar35; lVar35 = lVar35 + 1) {
      lVar39 = *(long *)((long)__ptr + lVar35 * 8);
      if (0 < GA[lVar40].num_rstrctd) {
        lVar39 = GA[lVar40].rank_rstrctd[lVar39];
      }
      lVar26 = puVar1[lVar39];
      puVar1[lVar39] = lVar26 + 1;
      uVar21 = puVar1[lVar7 * 3 + lVar39];
      *(void **)(puVar13[lVar16 + uVar21] + lVar26 * 8) = v;
      lVar39 = i[lVar35];
      lVar30 = *(long *)((long)pvVar24 + uVar21 * 8 + lVar12);
      lVar29 = *(long *)((long)pvVar24 + uVar21 * 8 + lVar19);
      if ((lVar39 < lVar30) || (lVar29 < lVar39)) {
LAB_00171e0a:
        sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",uVar21 & 0xffffffff,
                lVar39,j[lVar35],lVar30,lVar29,*(undefined8 *)((long)pvVar24 + uVar21 * 8 + lVar33),
                *(undefined8 *)((long)pvVar24 + uVar21 * 8 + lVar18));
        pnga_error(err_string,g_a);
        lVar14 = j[lVar35];
        lVar15 = *(long *)((long)pvVar24 + uVar21 * 8 + lVar33);
        lVar39 = i[lVar35];
        lVar30 = *(long *)((long)pvVar24 + uVar21 * 8 + lVar12);
      }
      else {
        lVar14 = j[lVar35];
        lVar15 = *(long *)((long)pvVar24 + uVar21 * 8 + lVar33);
        if ((lVar14 < lVar15) || (*(long *)((long)pvVar24 + uVar21 * 8 + lVar18) < lVar14))
        goto LAB_00171e0a;
      }
      *(long *)(puVar13[uVar21] + lVar26 * 8) =
           (((lVar14 - lVar15) * *(long *)((long)pvVar24 + uVar21 * 8 + lVar8) + lVar39) - lVar30) *
           (long)iVar28 + *(long *)((long)pvVar24 + uVar21 * 8 + lVar34);
      v = (void *)((long)v + (long)iVar28);
    }
    switch(GA[lVar40].distr_type) {
    case 0:
      lVar34 = 0;
      lVar37 = lVar16;
      if (lVar16 < 1) {
        lVar37 = lVar34;
      }
      for (; lVar37 != lVar34; lVar34 = lVar34 + 1) {
        desc.src_ptr_array = (void **)puVar13[lVar34];
        desc.dst_ptr_array = (void **)puVar13[lVar16 + lVar34];
        uVar21 = puVar1[lVar7 * 2 + lVar34];
        desc.ptr_array_len = *(int *)(puVar1 + lVar7 + uVar21);
        if (iVar5 < 0) {
          if (0 < GA[lVar40].num_rstrctd) {
            uVar21 = GA[lVar40].rstrctd_list[uVar21];
          }
        }
        else {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar23].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar28;
        iVar10 = ARMCI_GetV(&desc,1,(int)uVar21);
        if (iVar10 != 0) {
          pnga_error("gather failed in armci",(long)iVar10);
        }
      }
      break;
    case 1:
      lVar34 = 0;
      lVar40 = lVar16;
      if (lVar16 < 1) {
        lVar40 = lVar34;
      }
      for (; lVar40 != lVar34; lVar34 = lVar34 + 1) {
        desc.src_ptr_array = (void **)puVar13[lVar34];
        desc.dst_ptr_array = (void **)puVar13[lVar16 + lVar34];
        uVar21 = (long)puVar1[lVar7 * 2 + lVar34] % lVar37;
        desc.ptr_array_len = *(int *)(puVar1 + lVar7 + puVar1[lVar7 * 2 + lVar34]);
        if (-1 < iVar5) {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar23].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar28;
        iVar10 = ARMCI_GetV(&desc,1,(int)uVar21);
        if (iVar10 != 0) {
          pnga_error("gather failed in armci",(long)iVar10);
        }
      }
      break;
    case 2:
      lVar34 = 0;
      lVar37 = lVar16;
      if (lVar16 < 1) {
        lVar37 = lVar34;
      }
      for (; lVar34 != lVar37; lVar34 = lVar34 + 1) {
        desc.src_ptr_array = (void **)puVar13[lVar34];
        desc.dst_ptr_array = (void **)puVar13[lVar16 + lVar34];
        lVar12 = puVar1[lVar7 * 2 + lVar34];
        desc.ptr_array_len = *(int *)(puVar1 + lVar7 + lVar12);
        sVar2 = GA[lVar40].ndim;
        uVar27 = (uint)sVar2;
        lVar18 = (long)(int)lVar12 % GA[lVar40].num_blocks[0];
        lVar19 = lVar18;
        lVar33 = 0;
        while (lVar33 + 1 < (long)(int)uVar27) {
          lVar12 = ((int)lVar12 - lVar19) / GA[g_a + 1000].num_blocks[lVar33];
          lVar19 = (long)(int)lVar12 % GA[g_a + 1000].num_blocks[lVar33 + 1];
          *(long *)(err_string + lVar33 * 8 + 8) = lVar19;
          lVar33 = lVar33 + 1;
        }
        err_string._0_8_ = lVar18 % (long)GA[lVar40].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar40].nblock[1];
        uVar21 = 0;
        if (0 < sVar2) {
          uVar21 = (ulong)uVar27;
        }
        for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
          _lo[uVar31] = *(long *)(err_string + uVar31 * 8) % (long)GA[lVar40].nblock[uVar31];
        }
        uVar21 = _lo[(long)(int)uVar27 + -1];
        for (uVar27 = uVar27 - 2; -1 < (int)uVar27; uVar27 = uVar27 - 1) {
          uVar21 = uVar21 * (long)GA[lVar40].nblock[uVar27] + _lo[uVar27];
        }
        if (-1 < iVar5) {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar23].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar28;
        iVar10 = ARMCI_GetV(&desc,1,(int)uVar21);
        if (iVar10 != 0) {
          pnga_error("gather failed in armci",(long)iVar10);
        }
      }
      break;
    case 3:
    case 4:
      lVar34 = 0;
      lVar37 = lVar16;
      if (lVar16 < 1) {
        lVar37 = lVar34;
      }
      for (; lVar34 != lVar37; lVar34 = lVar34 + 1) {
        desc.src_ptr_array = (void **)puVar13[lVar34];
        desc.dst_ptr_array = (void **)puVar13[lVar16 + lVar34];
        lVar12 = puVar1[lVar7 * 2 + lVar34];
        desc.ptr_array_len = *(int *)(puVar1 + lVar7 + lVar12);
        sVar2 = GA[lVar40].ndim;
        uVar27 = (uint)sVar2;
        lVar18 = (long)(int)lVar12 % GA[lVar40].num_blocks[0];
        lVar19 = lVar18;
        lVar33 = 0;
        while (lVar33 + 1 < (long)(int)uVar27) {
          lVar12 = ((int)lVar12 - lVar19) / GA[g_a + 1000].num_blocks[lVar33];
          lVar19 = (long)(int)lVar12 % GA[g_a + 1000].num_blocks[lVar33 + 1];
          *(long *)(err_string + lVar33 * 8 + 8) = lVar19;
          lVar33 = lVar33 + 1;
        }
        err_string._0_8_ = lVar18 % (long)GA[lVar40].nblock[0];
        err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar40].nblock[1];
        uVar21 = 0;
        if (0 < sVar2) {
          uVar21 = (ulong)uVar27;
        }
        for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
          _lo[uVar31] = *(long *)(err_string + uVar31 * 8) % (long)GA[lVar40].nblock[uVar31];
        }
        uVar21 = _lo[(long)(int)uVar27 + -1];
        for (uVar27 = uVar27 - 2; -1 < (int)uVar27; uVar27 = uVar27 - 1) {
          uVar21 = uVar21 * (long)GA[lVar40].nblock[uVar27] + _lo[uVar27];
        }
        if (-1 < iVar5) {
          uVar21 = (ulong)(uint)PGRP_LIST[lVar23].inv_map_proc_list[uVar21];
        }
        desc.bytes = iVar28;
        iVar10 = ARMCI_GetV(&desc,1,(int)uVar21);
        if (iVar10 != 0) {
          pnga_error("gather failed in armci",(long)iVar10);
        }
      }
    }
    free(puVar13);
    free(__ptr);
  }
  return;
}

Assistant:

void pnga_gather2d(Integer g_a, void *v, Integer *i, Integer *j,
                         Integer nv)
{
    Integer k, kk, proc, item_size;
    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    Integer nproc, p_handle, iproc;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    Integer subscrpt[2];
    
    if (nv < 1) return;

    ga_check_handleM(g_a, "ga_gather");
    
    GAstat.numgat++;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }

    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int)(nproc *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int)(num_blocks *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
    
    owner = (Integer *)buf1; 
    count = owner+ nv;
    if (GA[handle].distr_type == REGULAR) {
      nelem = count + nproc;
      aproc = count + 2 * nproc;
      map =   count + 3 * nproc;
    } else {
      nelem = count + num_blocks;
      aproc = count + 2 * num_blocks;
      map =   count + 3 * num_blocks;
    }
   
    if (GA[handle].distr_type == REGULAR) {
      /* initialize the counters and nelem */
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }

    /* find proc or block that owns the (i,j) element; store it in temp: */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    GAstat.numgat_procs += naproc;
    
    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
          iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    item_size = GA[GA_OFFSET + g_a].elemsize;
    GAbytes.gattot += (double)item_size*nv;
    /*This stuff is probably completely wrong. Doesn't affect performance,
     * just statistics. */
    iproc = owner[GAme];
    GAbytes.gatloc += (double)item_size * nelem[iproc];

    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
          proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc]; 
        ptr_dst[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
                 (int)proc,(long)i[k],(long)j[k],
                 (long)ilo[proc],(long)ihi[proc],
                 (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_src[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);
}